

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O2

void __thiscall
adios2::query::BlockIndex<unsigned_char>::Evaluate
          (BlockIndex<unsigned_char> *this,QueryVar *query,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *resultBlockIDs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *this_00;
  Dims currShape;
  MinVarInfo *MinBlocksInfo;
  
  if (this->m_VarPtr != (Variable<unsigned_char> *)0x0) {
    iVar2 = (*this->m_IdxReader->_vptr_Engine[4])();
    core::VariableBase::Shape(&currShape,&this->m_VarPtr->super_VariableBase,0xffffffffffffffff);
    bVar1 = QueryVar::IsSelectionValid(query,&currShape);
    if (bVar1) {
      iVar3 = (*this->m_IdxReader->_vptr_Engine[0xb])
                        (this->m_IdxReader,this->m_VarPtr,CONCAT44(extraout_var,iVar2));
      MinBlocksInfo = (MinVarInfo *)CONCAT44(extraout_var_00,iVar3);
      if (MinBlocksInfo == (MinVarInfo *)0x0) {
        RunStatBlocksInfo(this,query,CONCAT44(extraout_var,iVar2),resultBlockIDs);
      }
      else {
        RunStatMinBlocksInfo(this,query,MinBlocksInfo,resultBlockIDs);
        std::_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
        ~_Vector_base(&(MinBlocksInfo->BlocksInfo).
                       super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                     );
        operator_delete(MinBlocksInfo);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&currShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unable to evaluate query! Invalid Variable detected");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Evaluate(const QueryVar &query, std::vector<BlockHit> &resultBlockIDs)
    {
        if (nullptr == m_VarPtr)
        {
            throw std::runtime_error("Unable to evaluate query! Invalid Variable detected");
        }

        size_t currStep = m_IdxReader.CurrentStep();
        adios2::Dims currShape = m_VarPtr->Shape();
        if (!query.IsSelectionValid(currShape))
            return;

        auto MinBlocksInfo = m_IdxReader.MinBlocksInfo(*m_VarPtr, currStep);

        if (MinBlocksInfo != nullptr)
        {
            RunStatMinBlocksInfo(query, MinBlocksInfo, resultBlockIDs);
            delete MinBlocksInfo;
        }
        else
        {
            RunStatBlocksInfo(query, currStep, resultBlockIDs);
        }
    }